

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O1

void google::RawLog__(LogSeverity severity,char *file,int line,char *format,...)

{
  char cVar1;
  size_t sVar2;
  char in_AL;
  bool bVar3;
  uint uVar4;
  pthread_t pVar5;
  char *pcVar6;
  ulong uVar7;
  size_t sVar8;
  char *format_00;
  anon_class_32_4_235673e4 *__f;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t size;
  char *buf;
  va_list ap;
  ostream oss;
  StaticStringBuf<3000UL> sbuf;
  char buffer [3000];
  size_t local_1a08;
  char *local_1a00;
  int local_19f8;
  LogSeverity local_19f4;
  char *local_19f0;
  undefined8 local_19e8;
  undefined1 *local_19e0;
  undefined1 *local_19d8;
  char *local_19c8;
  int local_19c0;
  char *local_19b8;
  ulong local_19b0;
  undefined1 local_19a8 [16];
  undefined8 auStack_1998 [32];
  undefined1 local_1898 [32];
  undefined8 local_1878;
  undefined8 local_1870;
  undefined4 local_1868;
  undefined8 local_1858;
  undefined8 local_1848;
  undefined8 local_1838;
  undefined8 local_1828;
  undefined8 local_1818;
  undefined8 local_1808;
  undefined8 local_17f8;
  undefined **local_17e0;
  char *local_17d8;
  char *pcStack_17d0;
  char *local_17c8;
  char *pcStack_17c0;
  char *local_17b8;
  char *pcStack_17b0;
  locale local_17a8 [8];
  char local_17a0 [3000];
  char local_be8 [3000];
  
  if (in_AL != '\0') {
    local_1868 = in_XMM0_Da;
    local_1858 = in_XMM1_Qa;
    local_1848 = in_XMM2_Qa;
    local_1838 = in_XMM3_Qa;
    local_1828 = in_XMM4_Qa;
    local_1818 = in_XMM5_Qa;
    local_1808 = in_XMM6_Qa;
    local_17f8 = in_XMM7_Qa;
  }
  local_19f0 = file;
  local_1878 = in_R8;
  local_1870 = in_R9;
  if ((((fLB::FLAGS_logtostdout != '\0') || (fLB::FLAGS_logtostderr != '\0')) ||
      (fLI::FLAGS_stderrthreshold <= (int)severity)) ||
     ((fLB::FLAGS_alsologtostderr != '\0' || (bVar3 = IsGoogleLoggingInitialized(), !bVar3)))) {
    local_17e0 = (undefined **)__assert_fail;
    local_17d8 = (char *)0x0;
    pcStack_17d0 = (char *)0x0;
    local_17c8 = (char *)0x0;
    pcStack_17c0 = (char *)0x0;
    local_17b8 = (char *)0x0;
    pcStack_17b0 = (char *)0x0;
    std::locale::locale(local_17a8);
    local_17e0 = &PTR__streambuf_0012ec10;
    local_17c8 = local_be8;
    local_17d8 = local_17a0;
    pcStack_17d0 = local_17a0;
    pcStack_17c0 = local_17a0;
    local_17b8 = local_17a0;
    pcStack_17b0 = local_17c8;
    std::ostream::ostream(local_19a8,(streambuf *)&local_17e0);
    *(undefined8 *)((long)auStack_1998 + (long)*(_func_int **)(local_19a8._0_8_ + -0x18)) = 5;
    pVar5 = pthread_self();
    if (pVar5 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_19a8,"thread::id of a non-executing thread",0x24);
    }
    else {
      std::ostream::_M_insert<unsigned_long>((ulong)local_19a8);
    }
    local_1a00 = local_be8;
    local_1a08 = 3000;
    cVar1 = **(char **)(LogSeverityNames + (ulong)severity * 8);
    local_19f4 = severity;
    if (((local_17b8 != pcStack_17c0) && (local_17b8 != pcStack_17b0)) && (local_17b8[-1] != '\0'))
    {
      if (local_17b8 < pcStack_17b0) {
        *local_17b8 = '\0';
        local_17b8 = local_17b8 + 1;
      }
      else {
        (*(code *)local_17e0[0xd])(&local_17e0,0);
      }
    }
    pcVar6 = glog_internal_namespace_::const_basename(local_19f0);
    local_19f8 = line;
    DoRawLog(&local_1a00,&local_1a08,"%c00000000 00:00:00.000000 %s %s:%d] RAW: ",
             (ulong)(uint)(int)cVar1,local_17a0,pcVar6,line);
    pcVar6 = local_1a00;
    sVar2 = local_1a08;
    local_19d8 = local_1898;
    local_19e0 = &stack0x00000008;
    local_19e8 = 0x3000000020;
    uVar4 = vsnprintf(local_1a00,local_1a08,format,&local_19e8);
    format_00 = "RAW_LOG ERROR: The Message was too long!\n";
    if (-1 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
      if (uVar7 <= sVar2) {
        local_1a00 = pcVar6 + uVar7;
        format_00 = "\n";
        local_1a08 = sVar2 - uVar7;
      }
    }
    DoRawLog(&local_1a00,&local_1a08,format_00);
    sVar8 = strlen(local_be8);
    __f = (anon_class_32_4_235673e4 *)0x2;
    syscall(1,2,local_be8,sVar8);
    if (local_19f4 == FATAL) {
      local_19c8 = local_19f0;
      local_19c0 = local_19f8;
      local_19b8 = pcVar6;
      local_19b0 = sVar2;
      std::call_once<google::RawLog__(google::LogSeverity,char_const*,int,char_const*,___)::__0>
                ((once_flag *)&local_19c8,__f);
      LogMessage::Fail();
    }
    std::ios_base::~ios_base((ios_base *)(local_19a8 + 8));
    local_17e0 = (undefined **)__assert_fail;
    std::locale::~locale(local_17a8);
  }
  return;
}

Assistant:

void RawLog__(LogSeverity severity, const char* file, int line,
              const char* format, ...) {
  if (!(FLAGS_logtostdout || FLAGS_logtostderr ||
        severity >= FLAGS_stderrthreshold || FLAGS_alsologtostderr ||
        !IsGoogleLoggingInitialized())) {
    return;  // this stderr log message is suppressed
  }

  // We do not have any any option other that string streams to obtain the
  // thread identifier as the corresponding value is not convertible to an
  // integer. Use a statically allocated buffer to avoid dynamic memory
  // allocations.
  StaticStringBuf<kLogBufSize> sbuf;
  std::ostream oss(&sbuf);

  oss << std::setw(5) << std::this_thread::get_id();

  // can't call localtime_r here: it can allocate
  char buffer[kLogBufSize];
  char* buf = buffer;
  size_t size = sizeof(buffer);

  // NOTE: this format should match the specification in base/logging.h
  DoRawLog(&buf, &size, "%c00000000 00:00:00.000000 %s %s:%d] RAW: ",
           LogSeverityNames[severity][0], sbuf.data(),
           const_basename(const_cast<char*>(file)), line);

  // Record the position and size of the buffer after the prefix
  const char* msg_start = buf;
  const size_t msg_size = size;

  va_list ap;
  va_start(ap, format);
  bool no_chop = VADoRawLog(&buf, &size, format, ap);
  va_end(ap);
  if (no_chop) {
    DoRawLog(&buf, &size, "\n");
  } else {
    DoRawLog(&buf, &size, "RAW_LOG ERROR: The Message was too long!\n");
  }
  // We make a raw syscall to write directly to the stderr file descriptor,
  // avoiding FILE buffering (to avoid invoking malloc()), and bypassing
  // libc (to side-step any libc interception).
  // We write just once to avoid races with other invocations of RawLog__.
  safe_write(STDERR_FILENO, buffer, strlen(buffer));
  if (severity == GLOG_FATAL) {
    std::call_once(crashed, [file, line, msg_start, msg_size] {
      crash_reason.filename = file;
      crash_reason.line_number = line;
      memcpy(crash_buf, msg_start, msg_size);  // Don't include prefix
      crash_reason.message = crash_buf;
#ifdef HAVE_STACKTRACE
      crash_reason.depth =
          GetStackTrace(crash_reason.stack, ARRAYSIZE(crash_reason.stack), 1);
#else
      crash_reason.depth = 0;
#endif
      SetCrashReason(&crash_reason);
    });
    LogMessage::Fail();  // abort()
  }
}